

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderReturnTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  long *plVar3;
  TestNode *pTVar4;
  ulong uVar5;
  long *plVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  ReturnMode RVar10;
  bool bVar11;
  string description;
  string name;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  TestNode *local_68;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  
  pTVar2 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar2,(this->super_TestCaseGroup).m_context,"single_return_vertex"
             ,"Single return statement in function",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x128);
  RVar10 = RETURNMODE_ALWAYS;
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "single_return_fragment","Single return statement in function",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,evalReturnAlways);
  local_68 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = local_68;
  do {
    iVar8 = 1;
    do {
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"conditional_return_","");
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_c0 = *plVar6;
        lStack_b8 = plVar3[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar6;
        local_d0 = (long *)*plVar3;
      }
      local_c8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_b0 = &local_a0;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar3[3];
      }
      else {
        local_a0 = *plVar6;
        local_b0 = (long *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (RVar10 < RETURNMODE_LAST) {
        pcVar7 = (&PTR_anon_var_dwarf_2f8bb5_00d21708)[RVar10];
      }
      else {
        pcVar7 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,pcVar7,(allocator<char> *)&local_88);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_c0 = *plVar6;
        lStack_b8 = plVar3[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar6;
        local_d0 = (long *)*plVar3;
      }
      local_c8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      pTVar4 = (TestNode *)
               makeConditionalReturnInFuncCase
                         ((Context *)pTVar2[1]._vptr_TestNode,(char *)local_b0,(char *)local_d0,
                          RVar10,iVar8 == 1);
      tcu::TestNode::addChild(pTVar2,pTVar4);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 == 0);
    RVar10 = RVar10 + RETURNMODE_NEVER;
  } while (RVar10 != RETURNMODE_LAST);
  pTVar4 = (TestNode *)operator_new(0x128);
  pTVar2 = local_68;
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)local_68[1]._vptr_TestNode,"double_return_vertex"
             ,"Unconditional double return in function",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,"double_return_fragment"
             ,"Unconditional double return in function",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,
             "last_statement_in_main_vertex","Return as a final statement in main()",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,
             "last_statement_in_main_fragment","Return as a final statement in main()",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n    o_color = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  iVar8 = 0;
  do {
    local_60 = "";
    if (iVar8 != 0) {
      local_60 = "in_func_";
    }
    local_38 = " in main()";
    if (iVar8 != 0) {
      local_38 = " in user-defined function";
    }
    uVar1 = 0;
    do {
      local_90 = (ulong)uVar1;
      iVar9 = 1;
      do {
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"output_write_","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_f0 = &local_e0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar3[3];
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar3;
        }
        local_e8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*plVar3;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_b0 = &local_a0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_a0 = *plVar6;
          lStack_98 = plVar3[3];
        }
        else {
          local_a0 = *plVar6;
          local_b0 = (long *)*plVar3;
        }
        local_a8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if ((uint)local_90 < 3) {
          pcVar7 = (&PTR_anon_var_dwarf_2f8bb5_00d21708)[local_90];
        }
        else {
          pcVar7 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,pcVar7,(allocator<char> *)local_58);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_f0 = &local_e0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar3[3];
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar3;
        }
        local_e8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*plVar3;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        pTVar2 = local_68;
        pTVar4 = (TestNode *)
                 makeOutputWriteReturnCase
                           ((Context *)local_68[1]._vptr_TestNode,(char *)local_b0,(char *)local_d0,
                            iVar8 != 0,(ReturnMode)local_90,iVar9 == 1);
        tcu::TestNode::addChild(pTVar2,pTVar4);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        iVar9 = iVar9 + -1;
      } while (iVar9 == 0);
      uVar1 = (int)local_90 + 1;
    } while (uVar1 != 3);
    bVar11 = iVar8 == 0;
    iVar8 = iVar8 + 1;
  } while (bVar11);
  uVar5 = 0;
  do {
    local_60 = "occluded_static";
    if ((int)uVar5 != 0) {
      local_60 = "occluded_dynamic";
    }
    local_60 = local_60 + 9;
    RVar10 = RETURNMODE_ALWAYS;
    local_90 = uVar5;
    do {
      iVar8 = 1;
      do {
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"return_in_","");
        plVar3 = (long *)std::__cxx11::string::append((char *)local_58);
        local_88 = &local_78;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_78 = *plVar6;
          lStack_70 = plVar3[3];
        }
        else {
          local_78 = *plVar6;
          local_88 = (long *)*plVar3;
        }
        local_80 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_f0 = &local_e0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar3[3];
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar3;
        }
        local_e8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*plVar3;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_b0 = &local_a0;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_a0 = *plVar6;
          lStack_98 = plVar3[3];
        }
        else {
          local_a0 = *plVar6;
          local_b0 = (long *)*plVar3;
        }
        local_a8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        if (RVar10 < RETURNMODE_LAST) {
          pcVar7 = (&PTR_anon_var_dwarf_2f8bb5_00d21708)[RVar10];
        }
        else {
          pcVar7 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,pcVar7,(allocator<char> *)&local_88);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = plVar3[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*plVar3;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        pTVar2 = local_68;
        pTVar4 = (TestNode *)
                 makeReturnInLoopCase
                           ((Context *)local_68[1]._vptr_TestNode,(char *)local_b0,(char *)local_d0,
                            (int)local_90 != 0,RVar10,iVar8 == 1);
        tcu::TestNode::addChild(pTVar2,pTVar4);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 == 0);
      RVar10 = RVar10 + RETURNMODE_NEVER;
    } while (RVar10 != RETURNMODE_LAST);
    uVar5 = (ulong)((int)local_90 + 1);
  } while ((int)local_90 == 0);
  pTVar4 = (TestNode *)operator_new(0x128);
  pTVar2 = local_68;
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)local_68[1]._vptr_TestNode,
             "return_in_infinite_loop_vertex","Return in infinite loop",true,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coords;\nout highp vec4 v_color;\nuniform int ui_zero;\n\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x128);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar4,(Context *)pTVar2[1]._vptr_TestNode,
             "return_in_infinite_loop_fragment","Return in infinite loop",false,
             "#version 300 es\nin mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nuniform int ui_zero;\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    o_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways);
  tcu::TestNode::addChild(pTVar2,pTVar4);
  return extraout_EAX;
}

Assistant:

void ShaderReturnTests::init (void)
{
	// Single return statement in function.
	addChild(new ShaderReturnCase(m_context, "single_return_vertex", "Single return statement in function", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "single_return_fragment", "Single return statement in function", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			string name			= string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			addChild(makeConditionalReturnInFuncCase(m_context, name.c_str(), description.c_str(), (ReturnMode)returnMode, isFragment == 0));
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_context, "double_return_vertex", "Unconditional double return in function", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "double_return_fragment", "Unconditional double return in function", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name = string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string desc = string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";

				addChild(makeOutputWriteReturnCase(m_context, name.c_str(), desc.c_str(), inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name			= string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				addChild(makeReturnInLoopCase(m_context, name.c_str(), description.c_str(), isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec4 a_coords;\n"
		"out highp vec4 v_color;\n"
		"uniform int ui_zero;\n\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"#version 300 es\n"
		"in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"uniform int ui_zero;\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
}